

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

Regexp * duckdb_re2::Regexp::Capture(Regexp *sub,ParseFlags flags,int cap)

{
  Regexp *pRVar1;
  
  pRVar1 = (Regexp *)operator_new(0x28);
  pRVar1->op_ = '\v';
  pRVar1->simple_ = '\0';
  pRVar1->parse_flags_ = (uint16_t)flags;
  pRVar1->ref_ = 1;
  pRVar1->nsub_ = 1;
  pRVar1->down_ = (Regexp *)0x0;
  (pRVar1->arguments).char_class.cc_ = (CharClass *)0x0;
  (pRVar1->arguments).capture.name_ = (string *)0x0;
  (pRVar1->field_5).subone_ = sub;
  (pRVar1->arguments).repeat.max_ = cap;
  return pRVar1;
}

Assistant:

Regexp* Regexp::Capture(Regexp* sub, ParseFlags flags, int cap) {
  Regexp* re = new Regexp(kRegexpCapture, flags);
  re->AllocSub(1);
  re->sub()[0] = sub;
  re->arguments.capture.cap_ = cap;
  return re;
}